

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall Diligent::RefCountersImpl::RefCountersImpl(RefCountersImpl *this)

{
  size_t *local_18;
  RefCountersImpl *this_local;
  
  IReferenceCounters::IReferenceCounters(&this->super_IReferenceCounters);
  (this->super_IReferenceCounters)._vptr_IReferenceCounters =
       (_func_int **)&PTR_AddStrongRef_0058d670;
  local_18 = this->m_ObjectWrapperBuffer;
  do {
    *local_18 = 0;
    local_18 = local_18 + 1;
  } while ((atomic<int> *)local_18 != &this->m_NumStrongReferences);
  std::atomic<int>::atomic(&this->m_NumStrongReferences,0);
  std::atomic<int>::atomic(&this->m_NumWeakReferences,0);
  Threading::SpinLock::SpinLock(&this->m_Lock);
  std::atomic<Diligent::RefCountersImpl::ObjectState>::atomic(&this->m_ObjectState,NotInitialized);
  return;
}

Assistant:

RefCountersImpl() noexcept
    {
    }